

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

JavascriptArray * __thiscall
Js::NumberFormatPartsBuilder::ToPartsArray(NumberFormatPartsBuilder *this)

{
  UNumberFormatFields *pUVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  JavascriptArray *pJVar5;
  undefined4 *puVar6;
  JavascriptString *newValue;
  JavascriptString *newValue_00;
  DynamicObject *instance;
  uint uVar7;
  int iVar8;
  ulong uVar10;
  ulong uVar9;
  
  uVar7 = 0;
  pJVar5 = JavascriptLibrary::CreateArray
                     ((((this->sc).ptr)->super_ScriptContextBase).javascriptLibrary,0);
  if (this->formattedLength != 0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 0;
    do {
      iVar8 = (int)uVar9;
      if ((iVar8 != 0) && (pUVar1 = (this->fields).ptr, pUVar1[iVar8 - 1] == pUVar1[uVar9])) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x93d,"(start == 0 || fields[start - 1] != fields[start])",
                                    "start == 0 || fields[start - 1] != fields[start]");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      uVar3 = iVar8 + 1U;
      if (iVar8 + 1U < this->formattedLength) {
        uVar3 = this->formattedLength;
      }
      pUVar1 = (this->fields).ptr;
      uVar10 = uVar9;
      do {
        if (uVar3 - 1 == (int)uVar10) {
          uVar10 = (ulong)uVar3;
          break;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (pUVar1[uVar10] == pUVar1[uVar9]);
      newValue = GetPartTypeString(this,(this->fields).ptr[uVar9]);
      newValue_00 = JavascriptString::NewCopyBuffer
                              ((this->formatted).ptr + uVar9,(uint)uVar10 - iVar8,(this->sc).ptr);
      instance = JavascriptLibrary::CreateObject
                           ((((this->sc).ptr)->super_ScriptContextBase).javascriptLibrary,false,0);
      JavascriptOperators::InitProperty
                (&instance->super_RecyclableObject,0xf6,newValue,PropertyOperation_None);
      JavascriptOperators::InitProperty
                (&instance->super_RecyclableObject,0x197,newValue_00,PropertyOperation_None);
      (*(pJVar5->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJVar5,(ulong)uVar7,instance,0);
      uVar7 = uVar7 + 1;
      uVar9 = uVar10;
    } while ((uint)uVar10 < this->formattedLength);
  }
  return pJVar5;
}

Assistant:

JavascriptArray *ToPartsArray()
        {
            JavascriptArray *ret = sc->GetLibrary()->CreateArray(0);
            int retIndex = 0;

            // With the structure of the fields array, creating the resulting parts list to return to JS is simple
            // Map set parts to the corresponding `type` value (see ECMA-402 #sec-partitionnumberpattern), and unset parts to the `literal` type
            for (charcount_t start = 0; start < formattedLength; ++retIndex)
            {
                // At the top of the loop, fields[start] should always be different from fields[start - 1] (we should be at the start of a new part),
                // since start is adjusted later in the loop to the end of the part
                AssertOrFailFast(start == 0 || fields[start - 1] != fields[start]);

                charcount_t end = start + 1;
                while (end < formattedLength && fields[end] == fields[start])
                {
                    ++end;
                }

                JavascriptString *partType = GetPartTypeString(fields[start]);
                JavascriptString *partValue = JavascriptString::NewCopyBuffer(formatted + start, end - start, sc);

                DynamicObject* part = sc->GetLibrary()->CreateObject();
                JavascriptOperators::InitProperty(part, PropertyIds::type, partType);
                JavascriptOperators::InitProperty(part, PropertyIds::value, partValue);

                ret->SetItem(retIndex, part, PropertyOperationFlags::PropertyOperation_None);

                start = end;
            }

            return ret;
        }